

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCatchExpr
          (ExprVisitorDelegate *this,TryExpr *expr)

{
  WatWriter *this_00;
  char *s;
  TryExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  Dedent(this->writer_);
  this_00 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::Catch_Opcode);
  WritePutsSpace(this_00,s);
  Indent(this->writer_);
  ModuleContext::SetTopLabelType(&this->writer_->super_ModuleContext,Catch);
  WriteNewline(this->writer_,true);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCatchExpr(TryExpr* expr) {
  writer_->Dedent();
  writer_->WritePutsSpace(Opcode::Catch_Opcode.GetName());
  writer_->Indent();
  writer_->SetTopLabelType(LabelType::Catch);
  writer_->WriteNewline(FORCE_NEWLINE);
  return Result::Ok;
}